

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# docopt.cpp
# Opt level: O1

bool __thiscall
docopt::OneOrMore::match
          (OneOrMore *this,PatternList *left,
          vector<std::shared_ptr<docopt::LeafPattern>,_std::allocator<std::shared_ptr<docopt::LeafPattern>_>_>
          *collected)

{
  element_type *peVar1;
  uint uVar2;
  pointer psVar3;
  pointer psVar4;
  bool bVar5;
  long lVar6;
  bool bVar7;
  PatternList l_;
  vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
  local_b8;
  vector<std::shared_ptr<docopt::LeafPattern>,_std::allocator<std::shared_ptr<docopt::LeafPattern>_>_>
  local_98;
  PatternList *local_78;
  vector<std::shared_ptr<docopt::LeafPattern>,_std::allocator<std::shared_ptr<docopt::LeafPattern>_>_>
  *local_70;
  vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
  local_68;
  vector<std::shared_ptr<docopt::LeafPattern>,_std::allocator<std::shared_ptr<docopt::LeafPattern>_>_>
  local_48;
  
  local_78 = left;
  std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
  ::vector(&local_b8,left);
  local_70 = collected;
  std::
  vector<std::shared_ptr<docopt::LeafPattern>,_std::allocator<std::shared_ptr<docopt::LeafPattern>_>_>
  ::vector(&local_98,collected);
  local_68.
  super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.
  super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68.
  super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar2 = 1;
  lVar6 = 0;
  bVar5 = true;
  while ((uVar2 & 1) != 0) {
    peVar1 = (((this->super_BranchPattern).fChildren.
               super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->
             super___shared_ptr<docopt::Pattern,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    uVar2 = (*peVar1->_vptr_Pattern[2])(peVar1,&local_b8,&local_98);
    lVar6 = lVar6 + (ulong)(uVar2 & 0xff);
    if (bVar5) {
      bVar5 = false;
    }
    else if ((long)local_b8.
                   super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)local_b8.
                   super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                   ._M_impl.super__Vector_impl_data._M_start ==
             (long)local_68.
                   super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)local_68.
                   super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                   ._M_impl.super__Vector_impl_data._M_start) {
      bVar7 = local_b8.
              super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
              ._M_impl.super__Vector_impl_data._M_start ==
              local_b8.
              super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
      if (bVar7) {
LAB_0017ed43:
        if (bVar7) break;
      }
      else {
        psVar3 = local_b8.
                 super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        psVar4 = local_68.
                 super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if (((local_b8.
              super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
              ._M_impl.super__Vector_impl_data._M_start)->
            super___shared_ptr<docopt::Pattern,_(__gnu_cxx::_Lock_policy)2>)._M_ptr ==
            ((local_68.
              super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
              ._M_impl.super__Vector_impl_data._M_start)->
            super___shared_ptr<docopt::Pattern,_(__gnu_cxx::_Lock_policy)2>)._M_ptr) {
          do {
            psVar4 = psVar4 + 1;
            psVar3 = psVar3 + 1;
            bVar7 = psVar3 == local_b8.
                              super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish;
            if (bVar7) goto LAB_0017ed43;
          } while ((psVar3->super___shared_ptr<docopt::Pattern,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                   == (psVar4->super___shared_ptr<docopt::Pattern,_(__gnu_cxx::_Lock_policy)2>).
                      _M_ptr);
        }
      }
    }
    std::
    vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>::
    operator=(&local_68,&local_b8);
  }
  if (lVar6 != 0) {
    local_48.
    super__Vector_base<std::shared_ptr<docopt::LeafPattern>,_std::allocator<std::shared_ptr<docopt::LeafPattern>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)(local_78->
                  super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                  )._M_impl.super__Vector_impl_data._M_start;
    local_48.
    super__Vector_base<std::shared_ptr<docopt::LeafPattern>,_std::allocator<std::shared_ptr<docopt::LeafPattern>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         (pointer)(local_78->
                  super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish;
    local_48.
    super__Vector_base<std::shared_ptr<docopt::LeafPattern>,_std::allocator<std::shared_ptr<docopt::LeafPattern>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)(local_78->
                  super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                  )._M_impl.super__Vector_impl_data._M_end_of_storage;
    (local_78->
    super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
    )._M_impl.super__Vector_impl_data._M_start =
         local_b8.
         super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    (local_78->
    super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
    )._M_impl.super__Vector_impl_data._M_finish =
         local_b8.
         super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    (local_78->
    super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
    )._M_impl.super__Vector_impl_data._M_end_of_storage =
         local_b8.
         super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_b8.
    super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_b8.
    super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_b8.
    super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>::
    ~vector((vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
             *)&local_48);
    local_48.
    super__Vector_base<std::shared_ptr<docopt::LeafPattern>,_std::allocator<std::shared_ptr<docopt::LeafPattern>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (local_70->
         super__Vector_base<std::shared_ptr<docopt::LeafPattern>,_std::allocator<std::shared_ptr<docopt::LeafPattern>_>_>
         )._M_impl.super__Vector_impl_data._M_start;
    local_48.
    super__Vector_base<std::shared_ptr<docopt::LeafPattern>,_std::allocator<std::shared_ptr<docopt::LeafPattern>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         (local_70->
         super__Vector_base<std::shared_ptr<docopt::LeafPattern>,_std::allocator<std::shared_ptr<docopt::LeafPattern>_>_>
         )._M_impl.super__Vector_impl_data._M_finish;
    local_48.
    super__Vector_base<std::shared_ptr<docopt::LeafPattern>,_std::allocator<std::shared_ptr<docopt::LeafPattern>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (local_70->
         super__Vector_base<std::shared_ptr<docopt::LeafPattern>,_std::allocator<std::shared_ptr<docopt::LeafPattern>_>_>
         )._M_impl.super__Vector_impl_data._M_end_of_storage;
    (local_70->
    super__Vector_base<std::shared_ptr<docopt::LeafPattern>,_std::allocator<std::shared_ptr<docopt::LeafPattern>_>_>
    )._M_impl.super__Vector_impl_data._M_start =
         local_98.
         super__Vector_base<std::shared_ptr<docopt::LeafPattern>,_std::allocator<std::shared_ptr<docopt::LeafPattern>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    (local_70->
    super__Vector_base<std::shared_ptr<docopt::LeafPattern>,_std::allocator<std::shared_ptr<docopt::LeafPattern>_>_>
    )._M_impl.super__Vector_impl_data._M_finish =
         local_98.
         super__Vector_base<std::shared_ptr<docopt::LeafPattern>,_std::allocator<std::shared_ptr<docopt::LeafPattern>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    (local_70->
    super__Vector_base<std::shared_ptr<docopt::LeafPattern>,_std::allocator<std::shared_ptr<docopt::LeafPattern>_>_>
    )._M_impl.super__Vector_impl_data._M_end_of_storage =
         local_98.
         super__Vector_base<std::shared_ptr<docopt::LeafPattern>,_std::allocator<std::shared_ptr<docopt::LeafPattern>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_98.
    super__Vector_base<std::shared_ptr<docopt::LeafPattern>,_std::allocator<std::shared_ptr<docopt::LeafPattern>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_98.
    super__Vector_base<std::shared_ptr<docopt::LeafPattern>,_std::allocator<std::shared_ptr<docopt::LeafPattern>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_98.
    super__Vector_base<std::shared_ptr<docopt::LeafPattern>,_std::allocator<std::shared_ptr<docopt::LeafPattern>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    vector<std::shared_ptr<docopt::LeafPattern>,_std::allocator<std::shared_ptr<docopt::LeafPattern>_>_>
    ::~vector(&local_48);
  }
  std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
  ::~vector(&local_68);
  std::
  vector<std::shared_ptr<docopt::LeafPattern>,_std::allocator<std::shared_ptr<docopt::LeafPattern>_>_>
  ::~vector(&local_98);
  std::vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
  ::~vector(&local_b8);
  return lVar6 != 0;
}

Assistant:

bool OneOrMore::match(PatternList& left, std::vector<std::shared_ptr<LeafPattern>>& collected) const
{
	assert(fChildren.size() == 1);
	
	auto l = left;
	auto c = collected;
	
	bool matched = true;
	size_t times = 0;
	
	decltype(l) l_;
	bool firstLoop = true;
	
	while (matched) {
		// could it be that something didn't match but changed l or c?
		matched = fChildren[0]->match(l, c);
		
		if (matched)
			++times;
		
		if (firstLoop) {
			firstLoop = false;
		} else if (l == l_) {
			break;
		}
		
		l_ = l;
	}
	
	if (times == 0) {
		return false;
	}
	
	left = std::move(l);
	collected = std::move(c);
	return true;
}